

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

void __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
create_new_data_nodes
          (Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,data_node_type *old_node,model_node_type *parent,int fanout_tree_depth,
          vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
          *used_fanout_tree_nodes,int start_bucketID,int extra_duplication_factor)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  FTNode *pFVar7;
  self_type *psVar8;
  bool keep_left;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  data_node_type *pdVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  data_node_type *pdVar17;
  int left;
  int right;
  FTNode *tree_node;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  iVar4 = old_node->num_right_out_of_bounds_inserts_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (parent->super_AlexNode<double,_double>).model_.a_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (parent->super_AlexNode<double,_double>).model_.b_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = old_node->max_key_;
  tree_node = (used_fanout_tree_nodes->
              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              )._M_impl.super__Vector_impl_data._M_start;
  iVar5 = old_node->num_left_out_of_bounds_inserts_;
  iVar6 = old_node->num_inserts_;
  uVar16 = parent->num_children_ - 1;
  auVar22 = vfmadd213sd_fma(auVar22,auVar23,auVar21);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = old_node->min_key_;
  auVar2 = vfmadd231sd_fma(auVar21,auVar23,auVar2);
  uVar9 = ~((int)auVar22._0_8_ >> 0x1f) & (int)auVar22._0_8_;
  if ((int)uVar16 < (int)uVar9) {
    uVar9 = uVar16;
  }
  uVar10 = ~((int)auVar2._0_8_ >> 0x1f) & (int)auVar2._0_8_;
  if ((int)uVar10 <= (int)uVar16) {
    uVar16 = uVar10;
  }
  pFVar7 = (used_fanout_tree_nodes->
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  iVar14 = 0;
  pdVar17 = old_node->prev_leaf_;
  left = 0;
  do {
    if (tree_node == pFVar7) {
      psVar8 = old_node->next_leaf_;
      pdVar17->next_leaf_ = psVar8;
      if (psVar8 != (self_type *)0x0) {
        psVar8->prev_leaf_ = pdVar17;
      }
      return;
    }
    uVar10 = (fanout_tree_depth - tree_node->level) + extra_duplication_factor;
    iVar18 = 1 << (uVar10 & 0x1f);
    if ((double)iVar4 / (double)iVar6 <= 0.9) {
      keep_left = false;
    }
    else {
      keep_left = false;
      if (start_bucketID <= (int)uVar9) {
        keep_left = (int)uVar9 < iVar18 + start_bucketID;
      }
    }
    iVar18 = iVar18 + start_bucketID;
    tree_node->num_keys = tree_node->num_keys - iVar14;
    iVar11 = old_node->data_capacity_;
    right = tree_node->right_boundary;
    iVar14 = 0;
    while (right < iVar11) {
      dVar1 = old_node->key_slots_[right];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar1;
      if (((dVar1 == 1.79769313486232e+308) && (!NAN(dVar1))) ||
         (auVar20._8_8_ = 0, auVar20._0_8_ = (parent->super_AlexNode<double,_double>).model_.a_,
         auVar3._8_8_ = 0, auVar3._0_8_ = (parent->super_AlexNode<double,_double>).model_.b_,
         auVar2 = vfmadd213sd_fma(auVar19,auVar20,auVar3), iVar18 <= (int)auVar2._0_8_)) break;
      iVar14 = iVar14 + 1;
      iVar12 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
               ::get_next_filled_position(old_node,right,false);
      iVar11 = old_node->data_capacity_;
      right = iVar12 + 1;
      if (iVar11 < iVar12 + 1) {
        right = iVar11;
      }
    }
    tree_node->num_keys = tree_node->num_keys + iVar14;
    pdVar13 = bulk_load_leaf_node_from_existing
                        (this,old_node,left,right,false,tree_node,false,keep_left,
                         ((int)uVar16 < iVar18 && start_bucketID <= (int)uVar16) &&
                         0.9 < (double)iVar5 / (double)iVar6);
    (pdVar13->super_AlexNode<double,_double>).level_ =
         (parent->super_AlexNode<double,_double>).level_ + 1;
    (pdVar13->super_AlexNode<double,_double>).cost_ = tree_node->cost;
    (pdVar13->super_AlexNode<double,_double>).duplication_factor_ = (uint8_t)uVar10;
    dVar1 = tree_node->expected_avg_shifts;
    pdVar13->expected_avg_exp_search_iterations_ = tree_node->expected_avg_search_iterations;
    pdVar13->expected_avg_shifts_ = dVar1;
    pdVar13->prev_leaf_ = pdVar17;
    if (pdVar17 != (data_node_type *)0x0) {
      pdVar17->next_leaf_ = pdVar13;
    }
    for (lVar15 = (long)start_bucketID; lVar15 < iVar18; lVar15 = lVar15 + 1) {
      parent->children_[lVar15] = &pdVar13->super_AlexNode<double,_double>;
    }
    tree_node = tree_node + 1;
    pdVar17 = pdVar13;
    left = right;
    start_bucketID = iVar18;
  } while( true );
}

Assistant:

void create_new_data_nodes(
      const data_node_type* old_node, model_node_type* parent,
      int fanout_tree_depth,
      std::vector<fanout_tree::FTNode>& used_fanout_tree_nodes,
      int start_bucketID = 0, int extra_duplication_factor = 0) {
    bool append_mostly_right = old_node->is_append_mostly_right();
    int appending_right_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->max_key_), 0),
        parent->num_children_ - 1);
    bool append_mostly_left = old_node->is_append_mostly_left();
    int appending_left_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->min_key_), 0),
        parent->num_children_ - 1);

    // Create the new data nodes
    int cur = start_bucketID;  // first bucket with same child
    data_node_type* prev_leaf =
        old_node->prev_leaf_;  // used for linking the new data nodes
    int left_boundary = 0;
    int right_boundary = 0;
    // Keys may be re-assigned to an adjacent fanout tree node due to off-by-one
    // errors
    int num_reassigned_keys = 0;
    for (fanout_tree::FTNode& tree_node : used_fanout_tree_nodes) {
      left_boundary = right_boundary;
      auto duplication_factor = static_cast<uint8_t>(
          fanout_tree_depth - tree_node.level + extra_duplication_factor);
      int child_node_repeats = 1 << duplication_factor;
      bool keep_left = append_mostly_right && cur <= appending_right_bucketID &&
                       appending_right_bucketID < cur + child_node_repeats;
      bool keep_right = append_mostly_left && cur <= appending_left_bucketID &&
                        appending_left_bucketID < cur + child_node_repeats;
      right_boundary = tree_node.right_boundary;
      // Account for off-by-one errors due to floating-point precision issues.
      tree_node.num_keys -= num_reassigned_keys;
      num_reassigned_keys = 0;
      while (right_boundary < old_node->data_capacity_ &&
             old_node->get_key(right_boundary) !=
                 data_node_type::kEndSentinel_ &&
             parent->model_.predict(old_node->get_key(right_boundary)) <
                 cur + child_node_repeats) {
        num_reassigned_keys++;
        right_boundary = std::min(
            old_node->get_next_filled_position(right_boundary, false) + 1,
            old_node->data_capacity_);
      }
      tree_node.num_keys += num_reassigned_keys;
      data_node_type* child_node = bulk_load_leaf_node_from_existing(
          old_node, left_boundary, right_boundary, false, &tree_node, false,
          keep_left, keep_right);
      child_node->level_ = static_cast<short>(parent->level_ + 1);
      child_node->cost_ = tree_node.cost;
      child_node->duplication_factor_ = duplication_factor;
      child_node->expected_avg_exp_search_iterations_ =
          tree_node.expected_avg_search_iterations;
      child_node->expected_avg_shifts_ = tree_node.expected_avg_shifts;
      child_node->prev_leaf_ = prev_leaf;
      if (prev_leaf != nullptr) {
        prev_leaf->next_leaf_ = child_node;
      }
      for (int i = cur; i < cur + child_node_repeats; i++) {
        parent->children_[i] = child_node;
      }
      cur += child_node_repeats;
      prev_leaf = child_node;
    }
    prev_leaf->next_leaf_ = old_node->next_leaf_;
    if (old_node->next_leaf_ != nullptr) {
      old_node->next_leaf_->prev_leaf_ = prev_leaf;
    }
  }